

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O0

void __thiscall leveldb::Benchmark::Benchmark(Benchmark *this)

{
  char *pcVar1;
  long *plVar2;
  ulong uVar3;
  bool bVar4;
  size_type sVar5;
  reference s;
  int local_1ac;
  FilterPolicy *local_1a0;
  Cache *local_190;
  Options local_180;
  allocator local_119;
  string local_118 [32];
  Status local_f8;
  allocator local_e9;
  string local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  Status local_88;
  Slice local_80;
  Slice local_70;
  ulong local_60;
  size_t i;
  string local_50 [32];
  Status local_30;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  Benchmark *this_local;
  
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  if (FLAGS_cache_size < 0) {
    local_190 = (Cache *)0x0;
  }
  else {
    local_190 = NewLRUCache((long)FLAGS_cache_size);
  }
  this->cache_ = local_190;
  if (FLAGS_bloom_bits < 0) {
    local_1a0 = (FilterPolicy *)0x0;
  }
  else {
    local_1a0 = NewBloomFilterPolicy(FLAGS_bloom_bits);
  }
  this->filter_policy_ = local_1a0;
  this->db_ = (DB *)0x0;
  this->num_ = FLAGS_num;
  this->value_size_ = FLAGS_value_size;
  this->entries_per_batch_ = 1;
  WriteOptions::WriteOptions(&this->write_options_);
  if (FLAGS_reads < 0) {
    local_1ac = FLAGS_num;
  }
  else {
    local_1ac = FLAGS_reads;
  }
  this->reads_ = local_1ac;
  this->heap_counter_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28);
  plVar2 = (anonymous_namespace)::g_env;
  pcVar1 = FLAGS_db;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,pcVar1,(allocator *)((long)&i + 7));
  (**(code **)(*plVar2 + 0x38))(&local_30,plVar2,local_50,local_28);
  Status::~Status(&local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  for (local_60 = 0; uVar3 = local_60,
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_28), pcVar1 = FLAGS_db, uVar3 < sVar5; local_60 = local_60 + 1) {
    s = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_28,local_60);
    Slice::Slice(&local_70,s);
    Slice::Slice(&local_80,"heap-");
    bVar4 = Slice::starts_with(&local_70,&local_80);
    plVar2 = (anonymous_namespace)::g_env;
    pcVar1 = FLAGS_db;
    if (bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,pcVar1,&local_e9);
      std::operator+(local_c8,(char *)local_e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_28,local_60);
      std::operator+(local_a8,local_c8);
      (**(code **)(*plVar2 + 0x40))(&local_88,plVar2,local_a8);
      Status::~Status(&local_88);
      std::__cxx11::string::~string((string *)local_a8);
      std::__cxx11::string::~string((string *)local_c8);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    }
  }
  if ((FLAGS_use_existing_db & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,pcVar1,&local_119);
    Options::Options(&local_180);
    DestroyDB((leveldb *)&local_f8,(string *)local_118,&local_180);
    Status::~Status(&local_f8);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

Benchmark()
      : cache_(FLAGS_cache_size >= 0 ? NewLRUCache(FLAGS_cache_size) : nullptr),
        filter_policy_(FLAGS_bloom_bits >= 0
                           ? NewBloomFilterPolicy(FLAGS_bloom_bits)
                           : nullptr),
        db_(nullptr),
        num_(FLAGS_num),
        value_size_(FLAGS_value_size),
        entries_per_batch_(1),
        reads_(FLAGS_reads < 0 ? FLAGS_num : FLAGS_reads),
        heap_counter_(0) {
    std::vector<std::string> files;
    g_env->GetChildren(FLAGS_db, &files);
    for (size_t i = 0; i < files.size(); i++) {
      if (Slice(files[i]).starts_with("heap-")) {
        g_env->RemoveFile(std::string(FLAGS_db) + "/" + files[i]);
      }
    }
    if (!FLAGS_use_existing_db) {
      DestroyDB(FLAGS_db, Options());
    }
  }